

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall
avro::NonUnionToUnionParser::parse(NonUnionToUnionParser *this,Reader *reader,uint8_t *address)

{
  undefined8 uVar1;
  type pRVar2;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  uint8_t *location;
  uint8_t *value;
  GenericUnionSetter *setter;
  int64_t *choice;
  
  avro::operator<<((NoOp *)&noop,(char (*) [27])"Reading non-union to union");
  *(undefined8 *)(in_RDX + *(long *)(in_RDI + 0x28)) = *(undefined8 *)(in_RDI + 0x18);
  uVar1 = (**(code **)(in_RDX + *(long *)(in_RDI + 0x30)))
                    (in_RDX + *(long *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 0x18));
  pRVar2 = boost::shared_ptr<avro::Resolver>::operator->((shared_ptr<avro::Resolver> *)(in_RDI + 8))
  ;
  (**pRVar2->_vptr_Resolver)(pRVar2,in_RSI,uVar1);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        DEBUG_OUT("Reading non-union to union");

        int64_t *choice = reinterpret_cast<int64_t *>(address + choiceOffset_);
        *choice = choice_;
        GenericUnionSetter* setter = reinterpret_cast<GenericUnionSetter *> (address + setFuncOffset_);
        uint8_t *value = reinterpret_cast<uint8_t *> (address + offset_);
        uint8_t *location = (*setter)(value, choice_);

        resolver_->parse(reader, location);
    }